

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Parser::parameterList_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  undefined8 extraout_RAX;
  Token param;
  Token comma;
  allocator<char> local_1c1;
  string local_1c0;
  string local_1a0;
  Token local_180;
  Token local_110;
  Token local_a0;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Tokenizer::getToken(&local_180,this->tokenizer);
  if (local_180._symbol != ')') {
    do {
      std::__cxx11::string::string((string *)&local_110,(string *)&local_180);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_110._name);
      std::__cxx11::string::~string((string *)&local_110);
      Tokenizer::getToken(&local_110,this->tokenizer);
      bVar1 = true;
      if (local_110._symbol != ')') {
        if (local_110._symbol != ',') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a0,"Parser::parameterList",(allocator<char> *)&local_a0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c0,"Expected an , sign, instead got",&local_1c1);
          die(this,&local_1a0,&local_1c0,&local_110);
          Token::~Token(&local_180);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(__return_storage_ptr__);
          _Unwind_Resume(extraout_RAX);
        }
        Tokenizer::getToken(&local_a0,this->tokenizer);
        Token::operator=(&local_180,&local_a0);
        Token::~Token(&local_a0);
        bVar1 = false;
      }
      Token::~Token(&local_110);
    } while ((!bVar1) && (local_180._symbol != ')'));
  }
  Tokenizer::ungetToken(this->tokenizer);
  Token::~Token(&local_180);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>Parser::parameterList(){
    std::vector<std::string>params;
    Token param = tokenizer.getToken();
    while(!param.isCloseParen()){
        params.push_back(param.getName());
        Token comma = tokenizer.getToken();
        if(comma.isCloseParen()) break;
        if(!comma.isComma())
            die("Parser::parameterList", "Expected an , sign, instead got", comma);
        param = tokenizer.getToken();
    }
    tokenizer.ungetToken();
    return params;
}